

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsOptions.cpp
# Opt level: O3

OptionStatus
setLocalOptionValue(HighsLogOptions *report_log_options,string *name,HighsLogOptions *log_options,
                   vector<OptionRecord_*,_std::allocator<OptionRecord_*>_> *option_records,
                   string *value_passed)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  HighsOptionType HVar2;
  pointer pcVar3;
  OptionRecordInt *option;
  _func_int **pp_Var4;
  _func_int *p_Var5;
  OptionRecordString *option_00;
  OptionRecordDouble *option_01;
  _Alloc_hider _Var6;
  HighsInt HVar7;
  bool bVar8;
  OptionStatus OVar9;
  uint uVar10;
  int iVar11;
  long lVar12;
  size_t sVar13;
  long lVar14;
  OptionStatus OVar15;
  double dVar16;
  double value;
  string value_trim;
  HighsInt index;
  bool value_bool;
  int scanned_num_char;
  string local_e0;
  int local_bc;
  string local_b8;
  uint local_94;
  string local_90;
  string local_70;
  string local_50;
  
  local_e0._M_dataplus._M_p = (pointer)&local_e0.field_2;
  pcVar3 = (value_passed->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_e0,pcVar3,pcVar3 + value_passed->_M_string_length);
  paVar1 = &local_b8.field_2;
  local_b8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8," ","");
  trim(&local_e0,&local_b8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != paVar1) {
    operator_delete(local_b8._M_dataplus._M_p);
  }
  OVar9 = getOptionIndex(report_log_options,name,option_records,&local_bc);
  OVar15 = kUnknownOption;
  if (OVar9 != kOk) goto LAB_0024f020;
  lVar14 = (long)local_bc;
  HVar2 = (option_records->super__Vector_base<OptionRecord_*,_std::allocator<OptionRecord_*>_>).
          _M_impl.super__Vector_impl_data._M_start[lVar14]->type;
  if (HVar2 == kDouble) {
    tolower((int)&local_e0);
    iVar11 = std::__cxx11::string::compare((char *)&local_e0);
    value = INFINITY;
    if (iVar11 != 0) {
      iVar11 = std::__cxx11::string::compare((char *)&local_e0);
      value = INFINITY;
      if (iVar11 != 0) {
        iVar11 = std::__cxx11::string::compare((char *)&local_e0);
        if (iVar11 == 0) {
          value = -INFINITY;
        }
        else {
          lVar12 = std::__cxx11::string::find_first_not_of((char *)&local_e0,0x3cbb87,0);
          _Var6._M_p = local_e0._M_dataplus._M_p;
          OVar15 = kIllegalValue;
          if (lVar12 != -1) goto LAB_0024f020;
          uVar10 = atoi(local_e0._M_dataplus._M_p);
          value = atof(_Var6._M_p);
          dVar16 = (double)(int)uVar10;
          if ((value == dVar16) && (!NAN(value) && !NAN(dVar16))) {
            highsLogDev(report_log_options,kInfo,
                        "setLocalOptionValue: Value = \"%s\" converts via atoi as %d so is %g as double, and %g via atof\n"
                        ,dVar16,value,_Var6._M_p,(ulong)uVar10);
          }
        }
      }
    }
    option_01 = (OptionRecordDouble *)
                (option_records->super__Vector_base<OptionRecord_*,_std::allocator<OptionRecord_*>_>
                )._M_impl.super__Vector_impl_data._M_start[lVar14];
    OVar15 = checkOptionValue(report_log_options,option_01,value);
    if (OVar15 != kOk) goto LAB_0024f020;
    *option_01->value = value;
  }
  else if (HVar2 == kInt) {
    lVar12 = std::__cxx11::string::find_first_not_of((char *)&local_e0,0x3cbb0c,0);
    _Var6._M_p = local_e0._M_dataplus._M_p;
    OVar15 = kIllegalValue;
    if (lVar12 != -1) goto LAB_0024f020;
    __isoc99_sscanf(local_e0._M_dataplus._M_p,"%d%n",&local_b8,&local_94);
    sVar13 = strlen(_Var6._M_p);
    HVar7 = (HighsInt)local_b8._M_dataplus._M_p;
    if (local_94 != (uint)sVar13) {
      OVar15 = kIllegalValue;
      highsLogDev(report_log_options,kError,
                  "setLocalOptionValue: Value = \"%s\" converts via sscanf as %d by scanning %d of %d characters\n"
                  ,local_e0._M_dataplus._M_p,(ulong)local_b8._M_dataplus._M_p & 0xffffffff,
                  (ulong)local_94,(uint)sVar13);
      goto LAB_0024f020;
    }
    option = (OptionRecordInt *)
             (option_records->super__Vector_base<OptionRecord_*,_std::allocator<OptionRecord_*>_>).
             _M_impl.super__Vector_impl_data._M_start[lVar14];
    OVar15 = checkOptionValue(report_log_options,option,(HighsInt)local_b8._M_dataplus._M_p);
    if (OVar15 != kOk) goto LAB_0024f020;
    *option->value = HVar7;
  }
  else {
    if (HVar2 != kBool) {
      iVar11 = std::__cxx11::string::compare((string *)name);
      if (iVar11 == 0) {
        pp_Var4 = (option_records->
                  super__Vector_base<OptionRecord_*,_std::allocator<OptionRecord_*>_>)._M_impl.
                  super__Vector_impl_data._M_start[lVar14][1]._vptr_OptionRecord;
        p_Var5 = *pp_Var4;
        local_b8._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_b8,p_Var5,pp_Var4[1] + (long)p_Var5);
        iVar11 = std::__cxx11::string::compare((string *)value_passed);
        if (iVar11 != 0) {
          local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
          pcVar3 = (value_passed->_M_dataplus)._M_p;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_90,pcVar3,pcVar3 + value_passed->_M_string_length);
          highsOpenLogFile(log_options,option_records,&local_90);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_90._M_dataplus._M_p != &local_90.field_2) {
            operator_delete(local_90._M_dataplus._M_p);
          }
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b8._M_dataplus._M_p != paVar1) {
          operator_delete(local_b8._M_dataplus._M_p);
        }
      }
      iVar11 = std::__cxx11::string::compare((string *)name);
      if (iVar11 == 0) {
        highsLogUser(report_log_options,kError,"setLocalOptionValue: model filename cannot be set\n"
                    );
      }
      else {
        option_00 = (OptionRecordString *)
                    (option_records->
                    super__Vector_base<OptionRecord_*,_std::allocator<OptionRecord_*>_>)._M_impl.
                    super__Vector_impl_data._M_start[lVar14];
        pcVar3 = (value_passed->_M_dataplus)._M_p;
        local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_70,pcVar3,pcVar3 + value_passed->_M_string_length);
        OVar15 = setLocalOptionValue(report_log_options,option_00,&local_70);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_70._M_dataplus._M_p != &local_70.field_2) {
          operator_delete(local_70._M_dataplus._M_p);
        }
      }
      goto LAB_0024f020;
    }
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_50,local_e0._M_dataplus._M_p,
               local_e0._M_dataplus._M_p + local_e0._M_string_length);
    bVar8 = boolFromString(&local_50,(bool *)&local_b8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p);
    }
    if (!bVar8) {
      OVar15 = kIllegalValue;
      highsLogUser(report_log_options,kError,
                   "setLocalOptionValue: Value \"%s\" cannot be interpreted as a bool\n",
                   local_e0._M_dataplus._M_p);
      goto LAB_0024f020;
    }
    *(undefined1 *)
     (option_records->super__Vector_base<OptionRecord_*,_std::allocator<OptionRecord_*>_>)._M_impl.
     super__Vector_impl_data._M_start[lVar14][1]._vptr_OptionRecord =
         local_b8._M_dataplus._M_p._0_1_;
  }
  OVar15 = kOk;
LAB_0024f020:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
    operator_delete(local_e0._M_dataplus._M_p);
  }
  return OVar15;
}

Assistant:

OptionStatus setLocalOptionValue(const HighsLogOptions& report_log_options,
                                 const std::string& name,
                                 HighsLogOptions& log_options,
                                 std::vector<OptionRecord*>& option_records,
                                 const std::string value_passed) {
  // Trim any leading and trailing spaces
  std::string value_trim = value_passed;
  trim(value_trim, " ");
  HighsInt index;
  OptionStatus status =
      getOptionIndex(report_log_options, name, option_records, index);
  if (status != OptionStatus::kOk) return status;
  HighsOptionType type = option_records[index]->type;
  if (type == HighsOptionType::kBool) {
    bool value_bool;
    bool return_status = boolFromString(value_trim, value_bool);
    if (!return_status) {
      highsLogUser(
          report_log_options, HighsLogType::kError,
          "setLocalOptionValue: Value \"%s\" cannot be interpreted as a bool\n",
          value_trim.c_str());
      return OptionStatus::kIllegalValue;
    }
    return setLocalOptionValue(((OptionRecordBool*)option_records[index])[0],
                               value_bool);
  } else if (type == HighsOptionType::kInt) {
    // Check that the string only contains legitimate characters
    if (value_trim.find_first_not_of("+-0123456789eE") != std::string::npos)
      return OptionStatus::kIllegalValue;
    HighsInt value_int;
    int scanned_num_char;
    const char* value_char = value_trim.c_str();
    sscanf(value_char, "%" HIGHSINT_FORMAT "%n", &value_int, &scanned_num_char);
    const int value_num_char = strlen(value_char);
    // Check that all characters in value_char are scanned by the format
    const bool converted_ok = scanned_num_char == value_num_char;
    if (!converted_ok) {
      highsLogDev(report_log_options, HighsLogType::kError,
                  "setLocalOptionValue: Value = \"%s\" converts via sscanf as "
                  "%" HIGHSINT_FORMAT
                  " "
                  "by scanning %" HIGHSINT_FORMAT " of %" HIGHSINT_FORMAT
                  " characters\n",
                  value_trim.c_str(), value_int, scanned_num_char,
                  value_num_char);
      return OptionStatus::kIllegalValue;
    }
    return setLocalOptionValue(report_log_options,
                               ((OptionRecordInt*)option_records[index])[0],
                               value_int);
  } else if (type == HighsOptionType::kDouble) {
    // Check that the string only contains legitimate characters -
    // after handling +/- inf
    double value_double = 0;
    tolower(value_trim);
    if (value_trim == "inf" || value_trim == "+inf") {
      value_double = kHighsInf;
    } else if (value_trim == "-inf") {
      value_double = -kHighsInf;
    } else {
      if (value_trim.find_first_not_of("+-.0123456789eE") != std::string::npos)
        return OptionStatus::kIllegalValue;
      HighsInt value_int = atoi(value_trim.c_str());
      value_double = atof(value_trim.c_str());
      double value_int_double = value_int;
      if (value_double == value_int_double) {
        highsLogDev(report_log_options, HighsLogType::kInfo,
                    "setLocalOptionValue: Value = \"%s\" converts via atoi as "
                    "%" HIGHSINT_FORMAT
                    " "
                    "so is %g as double, and %g via atof\n",
                    value_trim.c_str(), value_int, value_int_double,
                    value_double);
      }
    }
    return setLocalOptionValue(report_log_options,
                               ((OptionRecordDouble*)option_records[index])[0],
                               value_double);
  } else {
    // Setting a string option value
    if (!name.compare(kLogFileString)) {
      OptionRecordString& option = *(OptionRecordString*)option_records[index];
      std::string original_log_file = *(option.value);
      if (value_passed.compare(original_log_file)) {
        // Changing the name of the log file
        highsOpenLogFile(log_options, option_records, value_passed);
      }
    }
    if (!name.compare(kModelFileString)) {
      // Don't allow model filename to be changed - it's only an
      // option so that reading of run-time options works
      highsLogUser(report_log_options, HighsLogType::kError,
                   "setLocalOptionValue: model filename cannot be set\n");
      return OptionStatus::kUnknownOption;
    } else {
      return setLocalOptionValue(
          report_log_options, ((OptionRecordString*)option_records[index])[0],
          value_passed);
    }
  }
}